

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O0

void __thiscall
t_perl_generator::generate_use_includes
          (t_perl_generator *this,ostream *os,bool *done,t_type *type,bool selfish)

{
  ostream *poVar1;
  reference pptVar2;
  string local_a8;
  t_program *local_88;
  t_program *incProgram;
  size_type i;
  string local_68;
  t_program *local_48;
  size_type numInc;
  vector<t_program_*,_std::allocator<t_program_*>_> *currInc;
  t_program *current;
  t_type *ptStack_28;
  bool selfish_local;
  t_type *type_local;
  bool *done_local;
  ostream *os_local;
  t_perl_generator *this_local;
  
  current._7_1_ = selfish;
  ptStack_28 = type;
  type_local = (t_type *)done;
  done_local = (bool *)os;
  os_local = (ostream *)this;
  currInc = (vector<t_program_*,_std::allocator<t_program_*>_> *)t_type::get_program(type);
  if (((t_program *)currInc != (t_program *)0x0) &&
     (((ulong)(type_local->super_t_doc)._vptr_t_doc & 1) == 0)) {
    numInc = (size_type)t_program::get_includes((t_program *)currInc);
    local_48 = (t_program *)
               std::vector<t_program_*,_std::allocator<t_program_*>_>::size
                         ((vector<t_program_*,_std::allocator<t_program_*>_> *)numInc);
    if ((current._7_1_ & 1) != 0) {
      poVar1 = std::operator<<((ostream *)done_local,"use ");
      perl_namespace_abi_cxx11_(&local_68,this,(t_program *)currInc);
      poVar1 = std::operator<<(poVar1,(string *)&local_68);
      poVar1 = std::operator<<(poVar1,"Types;");
      std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_68);
    }
    for (incProgram = (t_program *)0x0; incProgram < local_48;
        incProgram = (t_program *)((long)&(incProgram->super_t_doc)._vptr_t_doc + 1)) {
      pptVar2 = std::vector<t_program_*,_std::allocator<t_program_*>_>::at
                          ((vector<t_program_*,_std::allocator<t_program_*>_> *)numInc,
                           (size_type)incProgram);
      local_88 = *pptVar2;
      poVar1 = std::operator<<((ostream *)done_local,"use ");
      perl_namespace_abi_cxx11_(&local_a8,this,local_88);
      poVar1 = std::operator<<(poVar1,(string *)&local_a8);
      poVar1 = std::operator<<(poVar1,"Types;");
      std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    std::operator<<((ostream *)done_local,(string *)&::endl_abi_cxx11_);
    *(undefined1 *)&(type_local->super_t_doc)._vptr_t_doc = 1;
  }
  return;
}

Assistant:

void t_perl_generator::generate_use_includes(std::ostream& os, bool& done, t_type *type, bool selfish) {
  t_program *current = type->get_program();
  if (current && !done) {
    std::vector<t_program*>& currInc = current->get_includes();
    std::vector<t_program*>::size_type numInc = currInc.size();
    if (selfish) {
      os << "use " << perl_namespace(current) << "Types;" << endl;
    }
    for (std::vector<t_program*>::size_type i = 0; i < numInc; ++i) {
      t_program* incProgram = currInc.at(i);
      os << "use " << perl_namespace(incProgram) << "Types;" << endl;
    }
    os << endl;
    done = true;
  }
}